

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::precisionQualifierCheck
          (TParseContext *this,TSourceLoc *loc,TBasicType baseType,TQualifier *qualifier,
          bool isCoopMatOrVec)

{
  bool bVar1;
  char *pcVar2;
  bool isCoopMatOrVec_local;
  TQualifier *qualifier_local;
  TBasicType baseType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  bVar1 = obeyPrecisionQualifiers(this);
  if ((bVar1) && (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0)) {
    if ((baseType == EbtAtomicUint) &&
       (((*(ulong *)&qualifier->field_0x8 >> 0x19 & 7) != 0 &&
        (((uint)(*(ulong *)&qualifier->field_0x8 >> 0x19) & 7) != 3)))) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"atomic counters can only be highp","atomic_uint","");
    }
    if (!isCoopMatOrVec) {
      if ((((baseType == EbtFloat) || (baseType == EbtUint)) || (baseType == EbtInt)) ||
         ((baseType == EbtSampler || (baseType == EbtAtomicUint)))) {
        if ((*(ulong *)&qualifier->field_0x8 >> 0x19 & 7) == 0) {
          bVar1 = TParseVersions::relaxedErrors((TParseVersions *)this);
          if (bVar1) {
            pcVar2 = TType::getBasicString(baseType);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,loc,"type requires declaration of default precision qualifier",pcVar2,
                       "substituting \'mediump\'");
          }
          else {
            pcVar2 = TType::getBasicString(baseType);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"type requires declaration of default precision qualifier",pcVar2,""
                      );
          }
          *(ulong *)&qualifier->field_0x8 =
               *(ulong *)&qualifier->field_0x8 & 0xfffffffff1ffffff | 0x4000000;
          this->defaultPrecision[baseType] = EpqMedium;
        }
      }
      else if ((*(ulong *)&qualifier->field_0x8 >> 0x19 & 7) != 0) {
        pcVar2 = TType::getBasicString(baseType);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"type cannot have precision qualifier",pcVar2,"");
      }
    }
  }
  return;
}

Assistant:

void TParseContext::precisionQualifierCheck(const TSourceLoc& loc, TBasicType baseType, TQualifier& qualifier, bool isCoopMatOrVec)
{
    // Built-in symbols are allowed some ambiguous precisions, to be pinned down
    // later by context.
    if (! obeyPrecisionQualifiers() || parsingBuiltins)
        return;

    if (baseType == EbtAtomicUint && qualifier.precision != EpqNone && qualifier.precision != EpqHigh)
        error(loc, "atomic counters can only be highp", "atomic_uint", "");

    if (isCoopMatOrVec)
        return;

    if (baseType == EbtFloat || baseType == EbtUint || baseType == EbtInt || baseType == EbtSampler || baseType == EbtAtomicUint) {
        if (qualifier.precision == EpqNone) {
            if (relaxedErrors())
                warn(loc, "type requires declaration of default precision qualifier", TType::getBasicString(baseType), "substituting 'mediump'");
            else
                error(loc, "type requires declaration of default precision qualifier", TType::getBasicString(baseType), "");
            qualifier.precision = EpqMedium;
            defaultPrecision[baseType] = EpqMedium;
        }
    } else if (qualifier.precision != EpqNone)
        error(loc, "type cannot have precision qualifier", TType::getBasicString(baseType), "");
}